

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::Combine<duckdb::MinMaxState<unsigned_int>,duckdb::MaxOperation>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  MinMaxState<unsigned_int> *source_00;
  MinMaxState<unsigned_int> *in_RCX;
  idx_t i;
  MinMaxState<unsigned_int> **tdata;
  MinMaxState<unsigned_int> **sdata;
  MinMaxState<unsigned_int> *target_00;
  
  FlatVector::GetData<duckdb::MinMaxState<unsigned_int>const*>((Vector *)0xfb2aa2);
  source_00 = (MinMaxState<unsigned_int> *)
              FlatVector::GetData<duckdb::MinMaxState<unsigned_int>*>((Vector *)0xfb2ab1);
  for (target_00 = (MinMaxState<unsigned_int> *)0x0; target_00 < in_RCX;
      target_00 = (MinMaxState<unsigned_int> *)((long)&target_00->value + 1)) {
    MaxOperation::Combine<duckdb::MinMaxState<unsigned_int>,duckdb::MaxOperation>
              (source_00,target_00,(AggregateInputData *)0xfb2aed);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}